

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::writeJSON(QPDFJob *this,QPDF *pdf)

{
  element_type *peVar1;
  FILE *pFVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 extraout_RAX;
  char *__s;
  undefined1 local_41;
  undefined1 local_40 [32];
  
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __s = (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (__s == (char *)0x0) {
    if ((peVar1->json_stream_data == qpdf_sj_file) &&
       ((peVar1->json_stream_prefix)._M_string_length == 0)) {
      local_40._0_8_ = (element_type *)(local_40 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,
                 "please specify --json-stream-prefix since the input file name is unknown","");
      usage((string *)local_40);
      if ((element_type *)local_40._0_8_ != (element_type *)(local_40 + 0x10)) {
        operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
      }
      _Unwind_Resume(extraout_RAX);
    }
    QPDFLogger::saveToStandardOutput
              ((peVar1->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true)
    ;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QPDFLogger::getSave((QPDFLogger *)local_40,
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  }
  else {
    if ((peVar1->json_stream_prefix)._M_string_length == 0) {
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&peVar1->json_stream_prefix,0,(char *)0x0,(ulong)__s);
      __s = (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    pFVar2 = QUtil::safe_fopen(__s,"w");
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002ecf90;
    this_00[1]._vptr__Sp_counted_base = (_func_int **)pFVar2;
    local_40._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_StdioFile,std::allocator<Pl_StdioFile>,char_const(&)[12],_IO_FILE*&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8),
               (Pl_StdioFile **)local_40,(allocator<Pl_StdioFile> *)&local_41,
               (char (*) [12])0x27564c,(_IO_FILE **)(this_00 + 1));
  }
  doJSON(this,pdf,(Pipeline *)local_40._0_8_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void
QPDFJob::writeJSON(QPDF& pdf)
{
    // File pipeline must have block scope so it will be closed after write.
    std::shared_ptr<QUtil::FileCloser> fc;
    std::shared_ptr<Pipeline> fp;
    if (m->outfilename.get()) {
        QTC::TC("qpdf", "QPDFJob write json to file");
        if (m->json_stream_prefix.empty()) {
            m->json_stream_prefix = m->outfilename.get();
        }
        fc = std::make_shared<QUtil::FileCloser>(QUtil::safe_fopen(m->outfilename.get(), "w"));
        fp = std::make_shared<Pl_StdioFile>("json output", fc->f);
    } else if ((m->json_stream_data == qpdf_sj_file) && m->json_stream_prefix.empty()) {
        QTC::TC("qpdf", "QPDFJob need json-stream-prefix for stdout");
        usage("please specify --json-stream-prefix since the input file name is unknown");
    } else {
        QTC::TC("qpdf", "QPDFJob write json to stdout");
        m->log->saveToStandardOutput(true);
        fp = m->log->getSave();
    }
    doJSON(pdf, fp.get());
}